

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::SoPlexBase<double>::getPrimalRay(SoPlexBase<double> *this,VectorBase<double> *vector)

{
  bool bVar1;
  
  bVar1 = hasPrimalRay(this);
  if ((bVar1) &&
     ((this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <=
      (int)((ulong)((long)(vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3))) {
    _syncRealSolution(this);
    SolBase<double>::getPrimalRaySol(&this->_solReal,vector);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SoPlexBase<R>::getPrimalRay(VectorBase<R>& vector)
{
   if(hasPrimalRay() && vector.dim() >= numCols())
   {
      _syncRealSolution();
      _solReal.getPrimalRaySol(vector);
      return true;
   }
   else
      return false;

}